

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerConvertIntToFloat(I64ToI32Lowering *this,Unary *curr)

{
  UnaryOp op;
  Index IVar1;
  pointer pBVar2;
  pointer pBVar3;
  LocalSet *any;
  pointer pBVar4;
  Const *pCVar5;
  LocalSet *append;
  pointer pBVar6;
  LocalGet *pLVar7;
  Unary *left;
  pointer this_00;
  Unary *right;
  Binary *pBVar8;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_01;
  Type local_b8;
  Type local_b0;
  Block *local_a8;
  Expression *result;
  Type TStack_98;
  UnaryOp convertHigh;
  undefined1 local_90 [8];
  TempVar highResult;
  Type local_60;
  undefined1 local_58 [8];
  TempVar lowBits;
  TempVar highBits;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  fetchOutParam((TempVar *)&lowBits.ty,this,curr->value);
  wasm::Type::Type(&local_60,i32);
  getTemp((TempVar *)local_58,this,local_60);
  wasm::Type::Type(&stack0xffffffffffffff68,i32);
  getTemp((TempVar *)local_90,this,TStack_98);
  if (curr->op - ConvertSInt64ToFloat32 < 2) {
    result._4_4_ = ConvertSInt32ToFloat64;
  }
  else {
    if (1 < curr->op - ConvertUInt64ToFloat32) {
      abort();
    }
    result._4_4_ = ConvertUInt32ToFloat64;
  }
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  any = Builder::makeLocalSet(pBVar3,IVar1,curr->value);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_90);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar5 = Builder::makeConst<int>(pBVar4,0);
  append = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pCVar5);
  this_01 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_01);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_01);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_01);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type(&local_b0,i32);
  pLVar7 = Builder::makeLocalGet(pBVar6,IVar1,local_b0);
  left = Builder::makeUnary(pBVar4,ConvertUInt32ToFloat64,(Expression *)pLVar7);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar5 = Builder::makeConst<double>(pBVar6,4294967296.0);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  op = result._4_4_;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
  wasm::Type::Type(&local_b8,i32);
  pLVar7 = Builder::makeLocalGet(this_00,IVar1,local_b8);
  right = Builder::makeUnary(pBVar6,op,(Expression *)pLVar7);
  pBVar8 = Builder::makeBinary(pBVar4,MulFloat64,(Expression *)pCVar5,(Expression *)right);
  pBVar8 = Builder::makeBinary(pBVar3,AddFloat64,(Expression *)left,(Expression *)pBVar8);
  local_a8 = Builder::blockify<wasm::Binary*>(pBVar2,(Expression *)any,(Expression *)append,pBVar8);
  if ((curr->op == ConvertSInt64ToFloat32) || (curr->op == ConvertUInt64ToFloat32)) {
    pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    local_a8 = (Block *)Builder::makeUnary(pBVar2,DemoteFloat64,(Expression *)local_a8);
  }
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)local_a8);
  TempVar::~TempVar((TempVar *)local_90);
  TempVar::~TempVar((TempVar *)local_58);
  TempVar::~TempVar((TempVar *)&lowBits.ty);
  return;
}

Assistant:

void lowerConvertIntToFloat(Unary* curr) {
    // Here the same strategy as `emcc` is taken which takes the two halves of
    // the 64-bit integer and creates a mathematical expression using float
    // arithmetic to reassemble the final floating point value.
    //
    // For example for i64 -> f32 we generate:
    //
    //  ((double) (unsigned) lowBits) +
    //      ((double) U32_MAX) * ((double) (int) highBits)
    //
    // Mostly just shuffling things around here with coercions and whatnot!
    // Note though that all arithmetic is done with f64 to have as much
    // precision as we can.
    //
    // NB: this is *not* accurate for i64 -> f32. Using f64s for intermediate
    // operations can give slightly inaccurate results in some cases, as we
    // round to an f64, then round again to an f32, which is not always the
    // same as a single rounding of i64 to f32 directly. Example:
    //
    //   #include <stdio.h>
    //   int main() {
    //     unsigned long long x = 18446743523953737727ULL;
    //     float y = x;
    //     double z = x;
    //     float w = z;
    //     printf("i64          : %llu\n"
    //            "i64->f32     : %f\n"
    //            "i64->f64     : %f\n"
    //            "i64->f64->f32: %f\n", x, y, z, w);
    //   }
    //
    //   i64          : 18446743523953737727
    //   i64->f32     : 18446742974197923840.000000 ;; correct rounding to f32
    //   i64->f64     : 18446743523953737728.000000 ;; correct rounding to f64
    //   i64->f64->f32: 18446744073709551616.000000 ;; incorrect rounding to f32
    //
    // This is even a problem if we use BigInts in JavaScript to represent
    // i64s, as Math.fround(BigInt) is not supported - the BigInt must be
    // converted to a Number first, so we again have that extra rounding.
    //
    // A more precise approach could use compiled floatdisf/floatundisf from
    // compiler-rt, but that is much larger and slower. (Note that we are in the
    // interesting situation of having f32 and f64 operations and only missing
    // i64 ones, so we have a different problem to solve than compiler-rt, and
    // maybe there is a better solution we haven't found yet.)
    TempVar highBits = fetchOutParam(curr->value);
    TempVar lowBits = getTemp();
    TempVar highResult = getTemp();

    UnaryOp convertHigh;
    switch (curr->op) {
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
        convertHigh = ConvertSInt32ToFloat64;
        break;
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        convertHigh = ConvertUInt32ToFloat64;
        break;
      default:
        abort();
    }

    Expression* result = builder->blockify(
      builder->makeLocalSet(lowBits, curr->value),
      builder->makeLocalSet(highResult, builder->makeConst(int32_t(0))),
      builder->makeBinary(
        AddFloat64,
        builder->makeUnary(ConvertUInt32ToFloat64,
                           builder->makeLocalGet(lowBits, Type::i32)),
        builder->makeBinary(
          MulFloat64,
          builder->makeConst((double)UINT_MAX + 1),
          builder->makeUnary(convertHigh,
                             builder->makeLocalGet(highBits, Type::i32)))));

    switch (curr->op) {
      case ConvertSInt64ToFloat32:
      case ConvertUInt64ToFloat32: {
        result = builder->makeUnary(DemoteFloat64, result);
        break;
      }
      default:
        break;
    }

    replaceCurrent(result);
  }